

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_string_utils.c
# Opt level: O3

int coda__pcre2_strcmp_8(PCRE2_SPTR8 str1,PCRE2_SPTR8 str2)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    bVar1 = str1[lVar3];
    bVar2 = str2[lVar3];
    if (bVar1 == 0 && bVar2 == 0) {
      return 0;
    }
    lVar3 = lVar3 + 1;
  } while (bVar1 == bVar2);
  return (bVar2 < bVar1) - 1 | 1;
}

Assistant:

int
PRIV(strcmp)(PCRE2_SPTR str1, PCRE2_SPTR str2)
{
PCRE2_UCHAR c1, c2;
while (*str1 != '\0' || *str2 != '\0')
  {
  c1 = *str1++;
  c2 = *str2++;
  if (c1 != c2) return ((c1 > c2) << 1) - 1;
  }
return 0;
}